

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visitParameterDeclaration_AtDeclarator
          (DeclarationBinder *this,ParameterDeclarationSyntax *node)

{
  Action AVar1;
  
  AVar1 = visit_AtSingleDeclarator_COMMON<psy::C::ParameterDeclarationSyntax>(this,node,0x306b08);
  return AVar1;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitParameterDeclaration_AtDeclarator(
        const ParameterDeclarationSyntax* node)
{
    return visit_AtSingleDeclarator_COMMON(
                node,
                &DeclarationBinder::visitParameterDeclaration_AtEnd);
}